

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

void find_trap(trap *trap)

{
  boolean bVar1;
  char *pcVar2;
  int iVar3;
  
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_001627b3:
    iVar3 = ((byte)trap->field_0x8 & 0x1f) - 1;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_001627b3;
    }
    iVar3 = display_rng(0x18);
  }
  trap->field_0x8 = trap->field_0x8 | 0x20;
  exercise(2,'\x01');
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    newsym((int)trap->tx,(int)trap->ty);
  }
  else {
    feel_location(trap->tx,trap->ty);
  }
  if (((*(ushort *)&level->locations[trap->tx][trap->ty].field_0x1 & 0x1ff8) == 0) &&
     ((level->locations[trap->tx][trap->ty].field_0x6 & 8) == 0)) {
    pcVar2 = an(trapexplain[iVar3]);
    pline("You find %s.",pcVar2);
    return;
  }
  cls();
  map_trap(trap,1);
  display_self();
  pcVar2 = an(trapexplain[iVar3]);
  pline("You find %s.",pcVar2);
  (*windowprocs.win_pause)(P_MAP);
  doredraw();
  return;
}

Assistant:

void find_trap(struct trap *trap)
{
    int tt = what_trap(trap->ttyp);
    boolean cleared = FALSE;

    trap->tseen = 1;
    exercise(A_WIS, TRUE);
    if (Blind)
	feel_location(trap->tx, trap->ty);
    else
	newsym(trap->tx, trap->ty);

    if (level->locations[trap->tx][trap->ty].mem_obj ||
	level->locations[trap->tx][trap->ty].mem_invis) {
    	/* There's too much clutter to see your find otherwise */
	cls();
	map_trap(trap, 1);
	display_self();
	cleared = TRUE;
    }

    pline("You find %s.", an(trapexplain[tt-1]));

    if (cleared) {
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}